

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageColorInvert(Image *image)

{
  int newFormat;
  Image image_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Color *pCVar5;
  undefined8 in_stack_ffffffffffffffd0;
  int local_20;
  int format;
  int x;
  int y;
  Color *pixels;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    uVar1 = image->width;
    uVar2 = image->height;
    uVar3 = image->mipmaps;
    uVar4 = image->format;
    image_00.height = uVar4;
    image_00.width = uVar3;
    image_00.data._4_4_ = uVar2;
    image_00.data._0_4_ = uVar1;
    image_00._16_8_ = in_stack_ffffffffffffffd0;
    pCVar5 = LoadImageColors(image_00);
    for (format = 0; format < image->height; format = format + 1) {
      for (local_20 = 0; local_20 < image->width; local_20 = local_20 + 1) {
        pCVar5[format * image->width + local_20].r =
             0xff - pCVar5[format * image->width + local_20].r;
        pCVar5[format * image->width + local_20].g =
             0xff - pCVar5[format * image->width + local_20].g;
        pCVar5[format * image->width + local_20].b =
             0xff - pCVar5[format * image->width + local_20].b;
      }
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar5;
    image->format = 7;
    ImageFormat(image,newFormat);
  }
  return;
}

Assistant:

void ImageColorInvert(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            pixels[y*image->width + x].r = 255 - pixels[y*image->width + x].r;
            pixels[y*image->width + x].g = 255 - pixels[y*image->width + x].g;
            pixels[y*image->width + x].b = 255 - pixels[y*image->width + x].b;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}